

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_variable.cpp
# Opt level: O0

double floatvalue(svalue_t *v)

{
  char *__nptr;
  double local_28;
  double local_20;
  double local_18;
  svalue_t *v_local;
  
  if (v->type == 0) {
    __nptr = FString::operator_cast_to_char_(&v->string);
    local_18 = atof(__nptr);
  }
  else {
    if (v->type == 6) {
      local_20 = (double)(v->value).i / 65536.0;
    }
    else {
      if (v->type == 2) {
        local_28 = -1.0;
      }
      else {
        local_28 = (double)(v->value).i;
      }
      local_20 = local_28;
    }
    local_18 = local_20;
  }
  return local_18;
}

Assistant:

double floatvalue(const svalue_t &v)
{
	return 
		v.type == svt_string ? atof(v.string) :       
		v.type == svt_fixed ? v.value.f / 65536. : 
		v.type == svt_mobj ? -1. : (double)v.value.i;
}